

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildLong2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  int iVar2;
  IRType fromType;
  bool bVar3;
  ValueType VVar4;
  RegOpnd *this_00;
  RegOpnd *this_01;
  undefined4 *puVar5;
  Instr *instr;
  Func *func;
  undefined6 in_register_00000032;
  OpCode opcode;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt64);
  VVar4 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar4);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyInt64);
  VVar4 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar4);
  iVar2 = (int)CONCAT62(in_register_00000032,newOpcode);
  switch(iVar2) {
  case 0x44:
    instr = IR::Instr::New(Ld_I4,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
    CheckJitLoopReturn(this,dstRegSlot,TyInt64);
    goto LAB_004bd56a;
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
switchD_004bd4a5_caseD_45:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xc55,"((0))","(0)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    instr = (Instr *)0x0;
    goto LAB_004bd56a;
  case 0x4a:
    fromType = TyInt8;
    break;
  case 0x4b:
    fromType = TyInt16;
    break;
  case 0x4c:
    fromType = TyInt32;
    break;
  default:
    if (iVar2 == 0x89) {
      func = this->m_func;
      opcode = PopCnt;
    }
    else if (iVar2 == 0x87) {
      func = this->m_func;
      opcode = InlineMathClz;
    }
    else if (iVar2 == 0x88) {
      func = this->m_func;
      opcode = Ctz;
    }
    else {
      if (iVar2 != 0xc) goto switchD_004bd4a5_caseD_45;
      func = this->m_func;
      opcode = Ld_I4;
    }
    instr = IR::Instr::New(opcode,&this_01->super_Opnd,&this_00->super_Opnd,func);
    goto LAB_004bd56a;
  }
  instr = CreateSignExtendInstr(this,&this_01->super_Opnd,&this_00->super_Opnd,fromType);
LAB_004bd56a:
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildLong2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt64);
    srcOpnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Ld_Long:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Clz_Long:
        instr = IR::Instr::New(Js::OpCode::InlineMathClz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Ctz_Long:
        instr = IR::Instr::New(Js::OpCode::Ctz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::PopCnt_Long:
        instr = IR::Instr::New(Js::OpCode::PopCnt, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Return_Long:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        CheckJitLoopReturn(dstRegSlot, TyInt64);
        break;
    case Js::OpCodeAsmJs::I64Extend8_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt8);
        break;
    case Js::OpCodeAsmJs::I64Extend16_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt16);
        break;
    case Js::OpCodeAsmJs::I64Extend32_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt32);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);
}